

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::DoMapBorder(CEditor *this)

{
  int iVar1;
  CLayer *pCVar2;
  int i_2;
  int i_1;
  int i;
  CLayerTiles *pT;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar3;
  
  pCVar2 = GetSelectedLayerType
                     ((CEditor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  for (iVar3 = 0; iVar1 = *(int *)((long)&pCVar2[1].m_pEditor + 4),
      SBORROW4(iVar3,iVar1 * 2) != iVar3 + iVar1 * -2 < 0; iVar3 = iVar3 + 1) {
    *(undefined1 *)(*(long *)(pCVar2[2].m_aName + 8) + (long)iVar3 * 4) = 1;
  }
  for (iVar3 = 0; iVar3 < *(int *)((long)&pCVar2[1].m_pEditor + 4) * *(int *)pCVar2[1].m_aName;
      iVar3 = iVar3 + 1) {
    if ((iVar3 % *(int *)((long)&pCVar2[1].m_pEditor + 4) < 2) ||
       (*(int *)((long)&pCVar2[1].m_pEditor + 4) + -3 <
        iVar3 % *(int *)((long)&pCVar2[1].m_pEditor + 4))) {
      *(undefined1 *)(*(long *)(pCVar2[2].m_aName + 8) + (long)iVar3 * 4) = 1;
    }
  }
  for (iVar3 = *(int *)((long)&pCVar2[1].m_pEditor + 4) * (*(int *)pCVar2[1].m_aName + -2);
      iVar3 < *(int *)((long)&pCVar2[1].m_pEditor + 4) * *(int *)pCVar2[1].m_aName;
      iVar3 = iVar3 + 1) {
    *(undefined1 *)(*(long *)(pCVar2[2].m_aName + 8) + (long)iVar3 * 4) = 1;
  }
  return;
}

Assistant:

void CEditor::DoMapBorder()
{
	CLayerTiles *pT = (CLayerTiles *)GetSelectedLayerType(0, LAYERTYPE_TILES);

	for(int i = 0; i < pT->m_Width*2; ++i)
		pT->m_pTiles[i].m_Index = 1;

	for(int i = 0; i < pT->m_Width*pT->m_Height; ++i)
	{
		if(i%pT->m_Width < 2 || i%pT->m_Width > pT->m_Width-3)
			pT->m_pTiles[i].m_Index = 1;
	}

	for(int i = (pT->m_Width*(pT->m_Height-2)); i < pT->m_Width*pT->m_Height; ++i)
		pT->m_pTiles[i].m_Index = 1;
}